

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
pstack::Reader::readObj<pstack::Elf::GnuHash::Header>
          (Reader *this,Off offset,Header *object,size_t count)

{
  ostringstream *poVar1;
  Exception *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  Exception local_1d8;
  Exception *local_38;
  
  if (count != 0) {
    iVar3 = (*this->_vptr_Reader[2])(this,offset,count << 4,object);
    if (CONCAT44(extraout_var,iVar3) != count << 4) {
      local_38 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1d8,0,0x1a0);
      Exception::Exception(&local_1d8);
      poVar1 = &local_1d8.str;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"incomplete object read from ",0x1c);
      (*this->_vptr_Reader[5])(this,poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," at offset ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," for ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes",6);
      pEVar2 = local_38;
      Exception::Exception(local_38,&local_1d8);
      __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

void
Reader::readObj(Off offset, Obj *object, size_t count) const
{
    if (count == 0)
        return;
    size_t rc = read(offset, count * sizeof *object, (char *)object);
    if (rc != count * sizeof *object)
        throw Exception() << "incomplete object read from " << *this
           << " at offset " << offset
           << " for " << count << " bytes";
}